

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O2

void despot::AEMS::Expand
               (VNode *vnode,BeliefLowerBound *lower_bound,BeliefUpperBound *upper_bound,
               BeliefMDP *model,History *history)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  log_ostream *plVar4;
  ostream *poVar5;
  QNode *this_00;
  QNode *qnode;
  QNode *local_48;
  BeliefLowerBound *local_40;
  BeliefUpperBound *local_38;
  
  local_40 = lower_bound;
  local_38 = upper_bound;
  this = VNode::children(vnode);
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar4 = logging::stream(4);
    poVar5 = std::operator<<(&plVar4->super_ostream,"- Expanding vnode ");
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  iVar1 = 0;
  while( true ) {
    iVar2 = (*(model->super_DSPOMDP)._vptr_DSPOMDP[5])(model);
    iVar3 = logging::level();
    if (iVar2 <= iVar1) break;
    if ((0 < iVar3) && (iVar2 = logging::level(), 3 < iVar2)) {
      plVar4 = logging::stream(4);
      poVar5 = std::operator<<(&plVar4->super_ostream," Action ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    this_00 = (QNode *)operator_new(0x88);
    QNode::QNode(this_00,vnode,iVar1);
    local_48 = this_00;
    std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::push_back(this,&local_48);
    Expand(local_48,local_40,local_38,model,history);
    iVar1 = iVar1 + 1;
  }
  if ((0 < iVar3) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar4 = logging::stream(4);
    poVar5 = std::operator<<(&plVar4->super_ostream,"* Expansion complete!");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return;
}

Assistant:

void AEMS::Expand(VNode* vnode, BeliefLowerBound* lower_bound,
	BeliefUpperBound* upper_bound, const BeliefMDP* model, History& history) {
	vector<QNode*>& children = vnode->children();
	logd << "- Expanding vnode " << vnode << endl;
	for (ACT_TYPE action = 0; action < model->NumActions(); action++) {
		logd << " Action " << action << endl;
		QNode* qnode = new QNode(vnode, action);
		children.push_back(qnode);

		Expand(qnode, lower_bound, upper_bound, model, history);
	}
	logd << "* Expansion complete!" << endl;
}